

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O3

FMFormat_conflict expand_format_from_rep(format_rep rep)

{
  undefined8 *puVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  FMFormat_conflict p_Var5;
  FMFormat_conflict *pp_Var6;
  FMStructDescList p_Var7;
  FMFormat_conflict p_Var8;
  ulong uVar9;
  format_rep rep_00;
  
  rep_00 = rep + 1;
  bVar2 = rep->subformat_count;
  p_Var5 = expand_subformat_from_rep((_subformat_wire_format *)rep_00);
  pp_Var6 = (FMFormat_conflict *)ffs_malloc((ulong)((bVar2 + 1) * 8));
  p_Var7 = (FMStructDescList)ffs_malloc((ulong)bVar2 * 0x20 + 0x40);
  if (bVar2 != 0) {
    uVar9 = 0;
    do {
      uVar3 = (((anon_union_28_2_f9eca8e2_for_f *)&rep_00->format_rep_length)->f0).
              subformat_rep_length;
      uVar3 = uVar3 << 8 | uVar3 >> 8;
      uVar4 = (uint)uVar3;
      if (rep_00->record_byte_order != '\0') {
        uVar4 = CONCAT22(rep_00[3].format_rep_length << 8 | rep_00[3].format_rep_length >> 8,uVar3);
      }
      rep_00 = (format_rep)((long)&rep_00->format_rep_length + (ulong)uVar4);
      p_Var8 = expand_subformat_from_rep((_subformat_wire_format *)rep_00);
      *(FMFormat_conflict *)((long)pp_Var6 + uVar9) = p_Var8;
      *(char **)((long)&p_Var7[1].format_name + uVar9 * 4) = p_Var8->format_name;
      *(FMFieldList *)((long)&p_Var7[1].field_list + uVar9 * 4) = p_Var8->field_list;
      (&p_Var7[1].struct_size)[uVar9] = p_Var8->record_length;
      *(undefined8 *)((long)&p_Var7[1].opt_info + uVar9 * 4) = 0;
      uVar9 = uVar9 + 8;
    } while ((uint)bVar2 * 8 != uVar9);
  }
  pp_Var6[bVar2] = (FMFormat_conflict)0x0;
  uVar9 = (ulong)((bVar2 + 1) * 0x20);
  *(undefined8 *)((long)&p_Var7->opt_info + uVar9) = 0;
  puVar1 = (undefined8 *)((long)&p_Var7->format_name + uVar9);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)((long)&p_Var7->struct_size + uVar9) = 0;
  p_Var7->format_name = p_Var5->format_name;
  p_Var7->field_list = p_Var5->field_list;
  p_Var7->struct_size = p_Var5->record_length;
  p_Var7->opt_info = (FMOptInfo *)0x0;
  p_Var5->subformats = pp_Var6;
  p_Var5->server_format_rep = rep;
  p_Var5->master_struct_list = p_Var7;
  return p_Var5;
}

Assistant:

extern FMFormat
expand_format_from_rep(format_rep rep)
{
    int format_count;
    FMFormat top_format;
    FMFormat *subformats;
    FMStructDescList master_struct_list;
    int i;

    struct _subformat_wire_format *subrep = (struct _subformat_wire_format*)
	(((char*)rep ) + sizeof(struct _format_wire_format_1));
    format_count = rep->subformat_count;
    top_format = expand_subformat_from_rep(subrep);
    subformats = malloc(sizeof(subformats[0]) * (format_count + 1));
    master_struct_list = malloc(sizeof(master_struct_list[0]) * (format_count+2));
    for (i = 0; i < format_count; i++) {
	UINT4 last_subrep_size = ntohs(subrep->f.f1.subformat_rep_length);
	if (subrep->f.f1.server_rep_version > 0) {
	    last_subrep_size += (ntohs(subrep->f.f1.top_bytes_subformat_rep_length) << 16);
	}
	subrep = (struct _subformat_wire_format*)(((char*)subrep) + last_subrep_size);
	subformats[i] = expand_subformat_from_rep(subrep);
	master_struct_list[i+1].format_name = subformats[i]->format_name;
	master_struct_list[i+1].field_list = subformats[i]->field_list;
	master_struct_list[i+1].struct_size = subformats[i]->record_length;
	master_struct_list[i+1].opt_info = NULL;
    }
    subformats[format_count] = NULL;
    master_struct_list[format_count+1].format_name = NULL;
    master_struct_list[format_count+1].field_list = NULL;
    master_struct_list[format_count+1].struct_size = 0;
    master_struct_list[format_count+1].opt_info = NULL;
    master_struct_list[0].format_name = top_format->format_name;
    master_struct_list[0].field_list = top_format->field_list;
    master_struct_list[0].struct_size = top_format->record_length;
    master_struct_list[0].opt_info = NULL;
    top_format->subformats = subformats;
    top_format->server_format_rep = rep;
    top_format->master_struct_list = master_struct_list;
    return top_format;
}